

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void tmat_to_dense(double *tmat,double *dmat,size_t n,double fill_diag)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  double *pdVar12;
  ulong uVar13;
  
  if ((n & 1) == 0) {
    lVar11 = (n >> 1) * (n - 1);
  }
  else {
    lVar11 = (n - 1 >> 1) * n;
  }
  uVar8 = (n - 2) * (n - 1);
  lVar7 = n * -2 + 4;
  pdVar12 = dmat;
  uVar13 = 0;
  while (sVar5 = n, uVar13 != n - 1) {
    lVar3 = lVar11 + -2;
    uVar6 = uVar8;
    lVar9 = lVar7;
    uVar10 = uVar13 + 1;
    for (lVar4 = 1; uVar13 + lVar4 < n; lVar4 = lVar4 + 1) {
      if (uVar13 < uVar13 + lVar4) {
        lVar2 = uVar10 + (lVar11 - uVar13) + ~(((n - uVar13) + -1) * (n - uVar13) >> 1);
      }
      else {
        lVar2 = lVar3 - (uVar6 >> 1);
      }
      dVar1 = tmat[lVar2];
      pdVar12[lVar4] = dVar1;
      pdVar12[sVar5] = dVar1;
      uVar10 = uVar10 + 1;
      lVar3 = lVar3 + -1;
      uVar6 = uVar6 + lVar9;
      lVar9 = lVar9 + 2;
      sVar5 = sVar5 + n;
    }
    uVar8 = uVar8 + lVar7;
    lVar7 = lVar7 + 2;
    pdVar12 = pdVar12 + n + 1;
    uVar13 = uVar13 + 1;
  }
  while (sVar5 != 0) {
    *dmat = fill_diag;
    dmat = dmat + n + 1;
    sVar5 = sVar5 - 1;
  }
  return;
}

Assistant:

void tmat_to_dense(double *restrict tmat, double *restrict dmat, size_t n, double fill_diag)
{
    size_t ncomb = calc_ncomb(n);
    for (size_t i = 0; i < (n-1); i++)
    {
        for (size_t j = i + 1; j < n; j++)
        {
            // dmat[i + j * n] = dmat[j + i * n] = tmat[i * (n - (i+1)/2) + j - i - 1];
            dmat[i + j * n] = dmat[j + i * n] = tmat[ix_comb(i, j, n, ncomb)];
        }
    }
    for (size_t i = 0; i < n; i++)
        dmat[i + i * n] = fill_diag;
}